

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::Prev(DBIter *this)

{
  Comparator *pCVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Slice local_60;
  Slice local_50;
  Slice local_40;
  Slice local_30;
  Slice local_20;
  DBIter *local_10;
  DBIter *this_local;
  
  local_10 = this;
  if ((this->valid_ & 1U) == 0) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                  ,0xd2,"virtual void leveldb::(anonymous namespace)::DBIter::Prev()");
  }
  if (this->direction_ == kForward) {
    uVar2 = (*this->iter_->_vptr_Iterator[2])();
    if ((uVar2 & 1) == 0) {
      __assert_fail("iter_->Valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                    ,0xd7,"virtual void leveldb::(anonymous namespace)::DBIter::Prev()");
    }
    iVar3 = (*this->iter_->_vptr_Iterator[8])();
    local_30.data_ = (char *)CONCAT44(extraout_var,iVar3);
    local_20 = ExtractUserKey(&local_30);
    SaveKey(this,&local_20,&this->saved_key_);
    do {
      (*this->iter_->_vptr_Iterator[7])();
      uVar2 = (*this->iter_->_vptr_Iterator[2])();
      if ((uVar2 & 1) == 0) {
        this->valid_ = false;
        std::__cxx11::string::clear();
        ClearSavedValue(this);
        return;
      }
      pCVar1 = this->user_comparator_;
      iVar3 = (*this->iter_->_vptr_Iterator[8])();
      local_50.data_ = (char *)CONCAT44(extraout_var_00,iVar3);
      local_40 = ExtractUserKey(&local_50);
      Slice::Slice(&local_60,&this->saved_key_);
      iVar3 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_40,&local_60);
    } while (-1 < iVar3);
    this->direction_ = kReverse;
  }
  FindPrevUserEntry(this);
  return;
}

Assistant:

void DBIter::Prev() {
  assert(valid_);

  if (direction_ == kForward) {  // Switch directions?
    // iter_ is pointing at the current entry.  Scan backwards until
    // the key changes so we can use the normal reverse scanning code.
    assert(iter_->Valid());  // Otherwise valid_ would have been false
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
    while (true) {
      iter_->Prev();
      if (!iter_->Valid()) {
        valid_ = false;
        saved_key_.clear();
        ClearSavedValue();
        return;
      }
      if (user_comparator_->Compare(ExtractUserKey(iter_->key()), saved_key_) <
          0) {
        break;
      }
    }
    direction_ = kReverse;
  }

  FindPrevUserEntry();
}